

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

char * __thiscall glcts::anon_unknown_0::LinkFailure::VertexShader_prop(LinkFailure *this)

{
  return 
  "#version 310 es                      \nin mediump vec4 posit;               \nin mediump vec4 p;                   \nvoid main(void)                      \n{                                    \n    gl_Position = p + posit;         \n}"
  ;
}

Assistant:

virtual const char* VertexShader_prop()
	{
		return "#version 310 es                      \n"
			   "in mediump vec4 posit;               \n"
			   "in mediump vec4 p;                   \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = p + posit;         \n"
			   "}";
	}